

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O2

uint_t flexfloat_pack_bits(flexfloat_desc_t desc,uint_t bits)

{
  ulong uVar1;
  byte bVar2;
  uint_t uVar3;
  ulong frac;
  ulong exp;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = desc.frac_bits;
  uVar4 = 1L << (desc.exp_bits + bVar2 & 0x3f);
  exp = (ulong)((uint)(bits >> (bVar2 & 0x3f)) & ~(-1 << (desc.exp_bits & 0x1f)));
  uVar5 = 1L << (bVar2 & 0x3f);
  uVar1 = uVar5 - 1;
  frac = uVar1 & bits;
  if (exp == 0 && frac == 0) {
    return (ulong)((uVar4 & bits) != 0) << 0x3f;
  }
  if (exp == 0) {
    exp = 0;
    while (frac != 0) {
      frac = frac * 2;
      if ((frac & uVar5) != 0) goto LAB_00130854;
      exp = exp - 1;
    }
    frac = 0;
LAB_00130854:
    frac = frac & uVar1;
  }
  uVar3 = flexfloat_pack(desc,(uVar4 & bits) != 0,exp,frac);
  return uVar3;
}

Assistant:

uint_t flexfloat_pack_bits(flexfloat_desc_t desc, uint_t bits)
{
    bool sign = (bits >> (desc.exp_bits + desc.frac_bits)) & 0x1;
    int_fast16_t exp = (bits >> desc.frac_bits) & ((0x1<<desc.exp_bits) - 1);
    uint_t frac = bits & ((UINT_C(1)<<desc.frac_bits) - 1);

    if(exp == 0 && frac == 0)
    {
        return PACK(sign, 0, 0);
    }
    else if(exp <= 0) // denormal
    {
        // printf("[ff_pack_bits] normalizing 0x%016lx, exp %d\n", frac, exp);
        while (frac && !((frac <<= 1) & (UINT_C(1) << desc.frac_bits))) // normalize
            exp--;
        frac &= ((UINT_C(1) << desc.frac_bits) - 1); // remove implicit bit
        // printf("[ff_pack_bits] done normalizing 0x%016lx, exp %d\n", frac, exp);
        return flexfloat_pack(desc, sign, exp, frac);
    }
    else
    {
        return flexfloat_pack(desc, sign, exp, frac);
    }
}